

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O1

int knownhost_writeline(LIBSSH2_KNOWNHOSTS *hosts,known_host *node,char *buf,size_t buflen,
                       size_t *outlen,int type)

{
  uint uVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  char *__format;
  LIBSSH2_SESSION *pLVar9;
  size_t sVar10;
  ulong uVar11;
  char *namealloc;
  char *saltalloc;
  char *local_58;
  char *local_40;
  char *local_38;
  long lVar12;
  
  if (type != 1) {
    pLVar9 = hosts->session;
    pcVar8 = "Unsupported type of known-host information store";
    goto LAB_0011bc7d;
  }
  uVar1 = node->typemask;
  sVar10 = (size_t)((uVar1 & 0x3c0000) - 0x40000 >> 0x12);
  switch(sVar10) {
  case 0:
    local_58 = (char *)0x0;
    break;
  case 1:
    sVar10 = 7;
    local_58 = "ssh-rsa";
    break;
  case 2:
    sVar10 = 7;
    local_58 = "ssh-dss";
    break;
  case 3:
    sVar10 = 0x13;
    local_58 = "ecdsa-sha2-nistp256";
    break;
  case 4:
    sVar10 = 0x13;
    local_58 = "ecdsa-sha2-nistp384";
    break;
  case 5:
    sVar10 = 0x13;
    local_58 = "ecdsa-sha2-nistp521";
    break;
  case 6:
    sVar10 = 0xb;
    local_58 = "ssh-ed25519";
    break;
  default:
switchD_0011bc59_caseD_7:
    pLVar9 = hosts->session;
    pcVar8 = "Unsupported type of known-host entry";
LAB_0011bc7d:
    iVar4 = _libssh2_error(pLVar9,-0x21,pcVar8);
    return iVar4;
  case 0xe:
    local_58 = node->key_type_name;
    if (local_58 == (char *)0x0) goto switchD_0011bc59_caseD_7;
    sVar10 = node->key_type_len;
  }
  pcVar8 = node->key;
  sVar5 = strlen(pcVar8);
  lVar12 = sVar10 + 1;
  if (sVar10 == 0) {
    lVar12 = 0;
  }
  uVar11 = lVar12 + sVar5;
  pcVar2 = node->comment;
  if (pcVar2 != (char *)0x0) {
    uVar11 = uVar11 + node->comment_len + 1;
  }
  if ((short)uVar1 != 2) {
    uVar11 = uVar11 + node->name_len + 3;
    if (uVar11 <= buflen) {
      if (pcVar2 == (char *)0x0 || sVar10 == 0) {
        if (pcVar2 == (char *)0x0) {
          if (sVar10 == 0) {
            snprintf(buf,buflen,"%s %s\n",node->name,pcVar8);
            goto LAB_0011bf20;
          }
          __format = "%s %s %s\n";
        }
        else {
          __format = "%s %s %s\n";
          local_58 = pcVar8;
          pcVar8 = pcVar2;
        }
      }
      else {
        __format = "%s %s %s %s\n";
      }
      snprintf(buf,buflen,__format,node->name,local_58,pcVar8);
    }
    goto LAB_0011bf20;
  }
  sVar6 = _libssh2_base64_encode(hosts->session,node->name,node->name_len,&local_40);
  pLVar9 = hosts->session;
  if (sVar6 == 0) {
    pcVar8 = "Unable to allocate memory for base64-encoded host name";
LAB_0011bece:
    iVar4 = _libssh2_error(pLVar9,-6,pcVar8);
    bVar3 = false;
  }
  else {
    sVar7 = _libssh2_base64_encode(pLVar9,node->salt,node->salt_len,&local_38);
    if (sVar7 == 0) {
      (*hosts->session->free)(local_40,&hosts->session->abstract);
      pLVar9 = hosts->session;
      pcVar8 = "Unable to allocate memory for base64-encoded salt";
      goto LAB_0011bece;
    }
    uVar11 = uVar11 + sVar6 + sVar7 + 7;
    if (uVar11 <= buflen) {
      if (node->comment == (char *)0x0 || sVar10 == 0) {
        if (node->comment == (char *)0x0) {
          if (sVar10 == 0) {
            pcVar8 = "|1|%s|%s %s\n";
            local_58 = node->key;
          }
          else {
            pcVar8 = "|1|%s|%s %s %s\n";
          }
        }
        else {
          pcVar8 = "|1|%s|%s %s %s\n";
          local_58 = node->key;
        }
      }
      else {
        pcVar8 = "|1|%s|%s %s %s %s\n";
      }
      snprintf(buf,buflen,pcVar8,local_38,local_40,local_58);
    }
    (*hosts->session->free)(local_40,&hosts->session->abstract);
    iVar4 = (*hosts->session->free)(local_38,&hosts->session->abstract);
    bVar3 = true;
  }
  if (!bVar3) {
    return iVar4;
  }
LAB_0011bf20:
  *outlen = uVar11 - 1;
  iVar4 = 0;
  if (buflen < uVar11) {
    iVar4 = _libssh2_error(hosts->session,-0x26,"Known-host write buffer too small");
  }
  return iVar4;
}

Assistant:

static int
knownhost_writeline(LIBSSH2_KNOWNHOSTS *hosts,
                    struct known_host *node,
                    char *buf, size_t buflen,
                    size_t *outlen, int type)
{
    size_t required_size;

    const char *key_type_name;
    size_t key_type_len;

    /* we only support this single file type for now, bail out on all other
       attempts */
    if(type != LIBSSH2_KNOWNHOST_FILE_OPENSSH)
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unsupported type of known-host information "
                              "store");

    switch(node->typemask & LIBSSH2_KNOWNHOST_KEY_MASK) {
    case LIBSSH2_KNOWNHOST_KEY_RSA1:
        key_type_name = NULL;
        key_type_len = 0;
        break;
    case LIBSSH2_KNOWNHOST_KEY_SSHRSA:
        key_type_name = "ssh-rsa";
        key_type_len = 7;
        break;
    case LIBSSH2_KNOWNHOST_KEY_SSHDSS:
        key_type_name = "ssh-dss";
        key_type_len = 7;
        break;
    case LIBSSH2_KNOWNHOST_KEY_ECDSA_256:
        key_type_name = "ecdsa-sha2-nistp256";
        key_type_len = 19;
        break;
    case LIBSSH2_KNOWNHOST_KEY_ECDSA_384:
        key_type_name = "ecdsa-sha2-nistp384";
        key_type_len = 19;
        break;
    case LIBSSH2_KNOWNHOST_KEY_ECDSA_521:
        key_type_name = "ecdsa-sha2-nistp521";
        key_type_len = 19;
        break;
    case LIBSSH2_KNOWNHOST_KEY_ED25519:
        key_type_name = "ssh-ed25519";
        key_type_len = 11;
        break;
    case LIBSSH2_KNOWNHOST_KEY_UNKNOWN:
        key_type_name = node->key_type_name;
        if(key_type_name) {
            key_type_len = node->key_type_len;
            break;
        }
        /* otherwise fallback to default and error */
        LIBSSH2_FALLTHROUGH();
    default:
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Unsupported type of known-host entry");
    }

    /* When putting together the host line there are three aspects to consider:
       - Hashed (SHA1) or unhashed hostname
       - key name or no key name (RSA1)
       - comment or no comment

       This means there are 2^3 different formats:
       ("|1|%s|%s %s %s %s\n", salt, hashed_host, key_name, key, comment)
       ("|1|%s|%s %s %s\n", salt, hashed_host, key_name, key)
       ("|1|%s|%s %s %s\n", salt, hashed_host, key, comment)
       ("|1|%s|%s %s\n", salt, hashed_host, key)
       ("%s %s %s %s\n", host, key_name, key, comment)
       ("%s %s %s\n", host, key_name, key)
       ("%s %s %s\n", host, key, comment)
       ("%s %s\n", host, key)

       Even if the buffer is too small, we have to set outlen to the number of
       characters the complete line would have taken.  We also don't write
       anything to the buffer unless we are sure we can write everything to the
       buffer. */

    required_size = strlen(node->key);

    if(key_type_len)
        required_size += key_type_len + 1; /* ' ' = 1 */
    if(node->comment)
        required_size += node->comment_len + 1; /* ' ' = 1 */

    if((node->typemask & LIBSSH2_KNOWNHOST_TYPE_MASK) ==
       LIBSSH2_KNOWNHOST_TYPE_SHA1) {
        char *namealloc;
        size_t name_base64_len;
        char *saltalloc;
        size_t salt_base64_len;

        name_base64_len = _libssh2_base64_encode(hosts->session, node->name,
                                                 node->name_len, &namealloc);
        if(!name_base64_len)
            return _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "base64-encoded host name");

        salt_base64_len = _libssh2_base64_encode(hosts->session,
                                                 node->salt, node->salt_len,
                                                 &saltalloc);
        if(!salt_base64_len) {
            LIBSSH2_FREE(hosts->session, namealloc);
            return _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "base64-encoded salt");
        }

        required_size += salt_base64_len + name_base64_len + 7;
        /* |1| + | + ' ' + \n + \0 = 7 */

        if(required_size <= buflen) {
            if(node->comment && key_type_len)
                snprintf(buf, buflen, "|1|%s|%s %s %s %s\n", saltalloc,
                         namealloc, key_type_name, node->key, node->comment);
            else if(node->comment)
                snprintf(buf, buflen, "|1|%s|%s %s %s\n", saltalloc, namealloc,
                         node->key, node->comment);
            else if(key_type_len)
                snprintf(buf, buflen, "|1|%s|%s %s %s\n", saltalloc, namealloc,
                         key_type_name, node->key);
            else
                snprintf(buf, buflen, "|1|%s|%s %s\n", saltalloc, namealloc,
                         node->key);
        }

        LIBSSH2_FREE(hosts->session, namealloc);
        LIBSSH2_FREE(hosts->session, saltalloc);
    }
    else {
        required_size += node->name_len + 3;
        /* ' ' + '\n' + \0 = 3 */

        if(required_size <= buflen) {
            if(node->comment && key_type_len)
                snprintf(buf, buflen, "%s %s %s %s\n", node->name,
                         key_type_name, node->key, node->comment);
            else if(node->comment)
                snprintf(buf, buflen, "%s %s %s\n", node->name, node->key,
                         node->comment);
            else if(key_type_len)
                snprintf(buf, buflen, "%s %s %s\n", node->name, key_type_name,
                         node->key);
            else
                snprintf(buf, buflen, "%s %s\n", node->name, node->key);
        }
    }

    /* we report the full length of the data with the trailing zero excluded */
    *outlen = required_size-1;

    if(required_size <= buflen)
        return LIBSSH2_ERROR_NONE;
    else
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                              "Known-host write buffer too small");
}